

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb_fastpforlib::internal::__fastpack12(uint64_t *in,uint32_t *out)

{
  uint uVar1;
  
  uVar1 = (uint)*in & 0xfff;
  *out = uVar1;
  *out = ((uint)in[1] & 0xfff) << 0xc | uVar1;
  Unroller<(unsigned_short)12,_(unsigned_short)2>::Pack(in,out);
  return;
}

Assistant:

void __fastpack12(const uint64_t *__restrict in, uint32_t *__restrict out) {
	Unroller<12>::Pack(in, out);
}